

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ParserPOMDPFormat_Spirit.h
# Opt level: O1

void __thiscall
POMDPFormatParsing::ParserPOMDPFormat_Spirit::InitializeObservations::operator()
          (InitializeObservations *this,iterator_t *str,iterator_t *end)

{
  Index IVar1;
  
  MADPComponentDiscreteObservations::ConstructJointObservations
            (&(this->_m_po->_m_decPOMDPDiscrete->super_DecPOMDPDiscrete).
              super_MultiAgentDecisionProcessDiscrete._m_O);
  MADPComponentDiscreteObservations::SetInitialized
            (&(this->_m_po->_m_decPOMDPDiscrete->super_DecPOMDPDiscrete).
              super_MultiAgentDecisionProcessDiscrete._m_O,true);
  IVar1 = (**(code **)(*(long *)&(this->_m_po->_m_decPOMDPDiscrete->super_DecPOMDPDiscrete).
                                 super_MultiAgentDecisionProcessDiscrete.
                                 super_MultiAgentDecisionProcess + 0xd0))();
  this->_m_po->_m_anyJOIndex = IVar1;
  return;
}

Assistant:

void operator()(iterator_t str, iterator_t end) const
            {
                _m_po->GetPOMDPDiscrete()->ConstructJointObservations();
                _m_po->GetPOMDPDiscrete()->SetObservationsInitialized(true);
                _m_po->_m_anyJOIndex = _m_po->GetPOMDPDiscrete()->
                    GetNrJointObservations();
            }